

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,GraphicsItemFlags flags)

{
  bool bVar1;
  Int IVar2;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> QVar3;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  int i;
  bool f;
  Stream *this;
  int local_40;
  Stream *pSVar4;
  undefined4 in_stack_ffffffffffffffd8;
  QDebug local_20;
  QDebug local_18;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  pSVar4 = in_RDI;
  QDebug::operator<<((QDebug *)in_RDI,(char)((ulong)in_RSI >> 0x38));
  bVar1 = false;
  for (local_40 = 0; local_40 < 0x11; local_40 = local_40 + 1) {
    local_10.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                   ((QFlags<QGraphicsItem::GraphicsItemFlag> *)this,(int)((ulong)in_RSI >> 0x20));
    IVar2 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
    if (IVar2 != 0) {
      if (bVar1) {
        QDebug::operator<<((QDebug *)this,(char)((ulong)in_RSI >> 0x38));
      }
      bVar1 = true;
      QDebug::QDebug(&local_20,in_RSI);
      QVar3.i = (Int)QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                               ((QFlags<QGraphicsItem::GraphicsItemFlag> *)this,
                                (int)((ulong)in_RSI >> 0x20));
      QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffdc);
      operator<<((QDebug *)CONCAT44(QVar3.i,in_stack_ffffffffffffffd8),
                 (GraphicsItemFlag)((ulong)pSVar4 >> 0x20));
      QDebug::~QDebug(&local_18);
      QDebug::~QDebug(&local_20);
    }
  }
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RSI >> 0x38));
  QDebug::QDebug((QDebug *)this,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QGraphicsItem::GraphicsItemFlags flags)
{
    debug << '(';
    bool f = false;
    for (int i = 0; i < 17; ++i) {
        if (flags & (1 << i)) {
            if (f)
                debug << '|';
            f = true;
            debug << QGraphicsItem::GraphicsItemFlag(int(flags & (1 << i)));
        }
    }
    debug << ')';
    return debug;
}